

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

MatrixXd * __thiscall
lf::uscalfe::FeLagrangeO2Quad<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeLagrangeO2Quad<double> *this)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_> *pCVar4;
  long lVar5;
  Index index;
  ulong uVar6;
  ActualDstType actualDst;
  long lVar7;
  Matrix<double,_2,_9,_0,_2,_9> nodes;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  Scalar local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_> local_c8;
  Matrix<double,_2,_9,_0,_2,_9> local_a8;
  
  local_c8.m_xpr = &local_a8;
  local_c8.m_row = 0;
  local_c8.m_col = 1;
  local_c8.m_currentBlockRows = 1;
  local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>.m_storage.m_data.array[0] =
       0.0;
  local_d0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (&local_c8,&local_d0);
  local_d8 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_d8);
  local_e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_e0);
  local_e8 = 0.5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_e8);
  local_f0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_f0);
  local_f8 = 0.5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_f8);
  local_100 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_100);
  local_108 = 0.5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_108);
  local_110 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_110);
  local_118 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_118);
  local_120 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_120);
  local_128 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_128);
  local_130 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_130);
  local_138 = 0.5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_138);
  local_140 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_140);
  local_148 = 0.5;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar4,&local_148);
  local_150 = 0.5;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_(pCVar4,&local_150);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::finished(&local_c8);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,0x12,2,9);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,2,9,0,2,9>,double,double>
            (__return_storage_ptr__,&local_a8,(assign_op<double,_double> *)&local_c8);
  pdVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  lVar5 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols *
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  uVar6 = lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar5) {
    lVar7 = 0;
    do {
      dVar3 = local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>.m_storage.m_data
              .array[lVar7 + 1];
      pdVar1 = pdVar2 + lVar7;
      *pdVar1 = local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>.m_storage.
                m_data.array[lVar7];
      pdVar1[1] = dVar3;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < lVar5) {
    do {
      pdVar2[uVar6] =
           local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>.m_storage.m_data.
           array[uVar6];
      uVar6 = uVar6 + 1;
    } while (lVar5 - uVar6 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    Eigen::Matrix<double, 2, 9> nodes;

    // clang-format off
    nodes << 0.0, 1.0, 1.0, 0.0,  0.5, 1.0, 0.5, 0.0,  0.5,
               0.0, 0.0, 1.0, 1.0,  0.0, 0.5, 1.0, 0.5,  0.5;
    // clang-format on
    return nodes;
  }